

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hand.cpp
# Opt level: O1

void __thiscall Hand::getFarthestFinger(Hand *this)

{
  pointer pFVar1;
  double dVar2;
  Finger *f;
  pointer pFVar3;
  Finger ff;
  double local_88;
  Point local_80;
  Point local_78;
  Finger local_70;
  
  Finger::Finger(&local_70);
  pFVar3 = (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
           super__Vector_impl_data._M_start;
  pFVar1 = (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pFVar3 != pFVar1) {
    local_88 = -1.0;
    do {
      local_78.x = (pFVar3->ptStart).x;
      local_78.y = (pFVar3->ptStart).y;
      local_80.x = (pFVar3->ptFar).x;
      local_80.y = (pFVar3->ptFar).y;
      dVar2 = getDist(&local_78,&local_80);
      if (local_88 < dVar2) {
        local_70.ptStart.x = (pFVar3->ptStart).x;
        local_70.ptStart.y = (pFVar3->ptStart).y;
        local_70.ptEnd.x = (pFVar3->ptEnd).x;
        local_70.ptEnd.y = (pFVar3->ptEnd).y;
        local_70.ptFar.x = (pFVar3->ptFar).x;
        local_70.ptFar.y = (pFVar3->ptFar).y;
        local_70.index = pFVar3->index;
        local_70.hndAngle = pFVar3->hndAngle;
        local_70.depth = pFVar3->depth;
        local_70.maxAngle = pFVar3->maxAngle;
        local_70.minDepth = pFVar3->minDepth;
        local_70.ok = pFVar3->ok;
        local_70.shouldCheckAngles = pFVar3->shouldCheckAngles;
        local_70.shouldCheckDist = pFVar3->shouldCheckDist;
        local_70._39_1_ = pFVar3->field_0x27;
        local_70.boundingBox.x = (pFVar3->boundingBox).x;
        local_70.boundingBox.y = (pFVar3->boundingBox).y;
        local_70.boundingBox.width = (pFVar3->boundingBox).width;
        local_70.boundingBox.height = (pFVar3->boundingBox).height;
        local_88 = dVar2;
      }
      pFVar3 = pFVar3 + 1;
    } while (pFVar3 != pFVar1);
  }
  (this->farthestFinger).ptStart.x = local_70.ptStart.x;
  (this->farthestFinger).ptStart.y = local_70.ptStart.y;
  (this->farthestFinger).ptEnd.x = local_70.ptEnd.x;
  (this->farthestFinger).ptEnd.y = local_70.ptEnd.y;
  (this->farthestFinger).ptFar.x = local_70.ptFar.x;
  (this->farthestFinger).ptFar.y = local_70.ptFar.y;
  (this->farthestFinger).depth = local_70.depth;
  (this->farthestFinger).maxAngle = local_70.maxAngle;
  (this->farthestFinger).minDepth = local_70.minDepth;
  (this->farthestFinger).ok = local_70.ok;
  (this->farthestFinger).shouldCheckAngles = local_70.shouldCheckAngles;
  (this->farthestFinger).shouldCheckDist = local_70.shouldCheckDist;
  (this->farthestFinger).field_0x27 = local_70._39_1_;
  (this->farthestFinger).index = local_70.index;
  (this->farthestFinger).hndAngle = local_70.hndAngle;
  (this->farthestFinger).boundingBox.x = local_70.boundingBox.x;
  (this->farthestFinger).boundingBox.y = local_70.boundingBox.y;
  (this->farthestFinger).boundingBox.width = local_70.boundingBox.width;
  (this->farthestFinger).boundingBox.height = local_70.boundingBox.height;
  return;
}

Assistant:

void Hand::getFarthestFinger() {
    double farthest = -1;
    double dist;
    Finger ff;
    for (Finger &f : fingers) {
        dist = getDist(f.ptStart, f.ptFar);
        if (dist > farthest) {
            farthest = dist;
            ff = f;
        }
    }
    farthestFinger = ff;
}